

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::input_read(Graph *this,string *name)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  int idLoadFactor;
  uint uVar4;
  int *piVar5;
  int id;
  int destinyId;
  int originId;
  double resistance;
  double reactance;
  double local_290;
  int n_edges;
  int num_nos;
  int vertexId;
  string aux;
  double local_250;
  double voltage;
  ifstream input;
  
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)name);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ifstream::ifstream((string *)&input);
  std::ifstream::open((string *)&input,(_Ios_Openmode)name);
  aux._M_dataplus._M_p = (pointer)&aux.field_2;
  aux._M_string_length = 0;
  aux.field_2._M_local_buf[0] = '\0';
  while (bVar2 = std::operator!=(&aux,"Vb"), bVar2) {
    std::operator>>((istream *)&input,(string *)&aux);
  }
  std::operator>>((istream *)&input,(string *)&aux);
  std::istream::_M_extract<double>((double *)&input);
  std::operator>>((istream *)&input,(string *)&aux);
  std::operator>>((istream *)&input,(string *)&aux);
  std::istream::_M_extract<double>((double *)&input);
  std::operator>>((istream *)&input,(string *)&aux);
  std::operator>>((istream *)&input,(string *)&aux);
  std::istream::_M_extract<double>((double *)&input);
  std::ifstream::close();
  std::ifstream::open((string *)&input,(_Ios_Openmode)name);
  do {
    std::operator>>((istream *)&input,(string *)&aux);
    bVar2 = std::operator!=(&aux,"num_nos");
  } while (bVar2);
  std::istream::operator>>((istream *)&input,&num_nos);
  for (uVar4 = 1; uVar1 = uVar4 % 0xd, (int)uVar4 <= num_nos * 0xd; uVar4 = uVar4 + 1) {
    if (uVar1 == 0xb) {
      std::istream::_M_extract<double>((double *)&input);
      local_250 = (local_250 / this->PB) * this->mw_factor;
      insertVertex(this,vertexId,local_290,local_250,voltage,idLoadFactor);
    }
    else if (uVar1 == 4) {
      std::istream::_M_extract<double>((double *)&input);
    }
    else if (uVar1 == 10) {
      std::istream::_M_extract<double>((double *)&input);
      local_290 = (local_290 / this->PB) * this->mw_factor;
    }
    else if (uVar1 == 1) {
      std::istream::operator>>((istream *)&input,&vertexId);
    }
    else {
      std::operator>>((istream *)&input,(string *)&aux);
    }
  }
  do {
    std::operator>>((istream *)&input,(string *)&aux);
    bVar2 = std::operator!=(&aux,"num_arestas");
  } while (bVar2);
  std::istream::operator>>((istream *)&input,&n_edges);
  uVar4 = 1;
  id = 0;
  do {
    if (n_edges * 0xc < (int)uVar4) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n");
      poVar3 = std::operator<<(poVar3,(string *)name);
      poVar3 = std::operator<<(poVar3," lida!");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&aux);
      std::ifstream::~ifstream(&input);
      return;
    }
    piVar5 = &destinyId;
    switch(uVar4 % 0xc) {
    case 1:
      piVar5 = &originId;
    case 2:
      std::istream::operator>>((istream *)&input,piVar5);
      break;
    case 3:
      std::istream::_M_extract<double>((double *)&input);
      resistance = resistance / this->ZB;
      break;
    case 4:
      std::istream::_M_extract<double>((double *)&input);
      reactance = reactance / this->ZB;
      id = id + 1;
      insertEdge(this,originId,destinyId,id,resistance,reactance,false);
      insertEdge(this,destinyId,originId,id,resistance,reactance,false);
      break;
    default:
      std::operator>>((istream *)&input,(string *)&aux);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void Graph::input_read( string name ){

    cout << name << endl;
    int edgeId = 0;
    double power, resistance, reactance, reactive_power, voltage;

    ifstream input;
    input.open(name);

    string aux;

    int n_col_v = 13, n_col_e = 12; //numero de colunas do arquivo de entradaz
    while(aux != "Vb") input >> aux;

    input >> aux;
    input >> VB;
    input >> aux;input >> aux;
    input >> PB;
    input >> aux;input >> aux;
    input >> ZB;

    input.close();
    input.open(name);
    int vertexId, originId, destinyId;

    do{
        input >> aux;
    }while(aux != "num_nos");///pula lixo ate chegar na parte de informacoes do no

    int num_nos;
    input >> num_nos;
    for(int i=1 ; i<=num_nos*n_col_v; i++){
        if(i % n_col_v == 1){
            input >> vertexId;
        }
        else if(i % n_col_v == 4){
            input >> voltage;
        }
        else if(i % n_col_v == 10){
            input >> power;
            power /= PB;
            power *= mw_factor;
        }
        else if(i % n_col_v == 11){
            input >> reactive_power;
            reactive_power /=PB;
            reactive_power *= mw_factor;
            insertVertex(vertexId, power, reactive_power, voltage);
        }
        else
            input >> aux;
    }

    do{
        input >> aux;
    }while(aux != "num_arestas");

    int n_edges;
    input >> n_edges;

    for(int i=1 ; i<=n_edges*n_col_e; i++){
        if(i % n_col_e == 1){
            input >> originId;
        }
        else if(i % n_col_e == 2){
            input >> destinyId;
        }
        else if(i % n_col_e == 3){
            input >> resistance;
            resistance /= ZB;
        }
        else if(i % n_col_e == 4){
            input >> reactance;
            reactance /= ZB;

            edgeId++;
            insertEdge(originId, destinyId, edgeId, resistance, reactance, false);
            insertEdge(destinyId, originId, edgeId, resistance, reactance, false);
        }
        else
            input >> aux;
    }
    cout << "\n" << name << " lida!" << endl;
}